

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

int64_t file_stdio_ftell(ALLEGRO_FILE *f)

{
  USERDATA *pUVar1;
  __off_t _Var2;
  int *piVar3;
  int64_t ret;
  USERDATA *userdata;
  ALLEGRO_FILE *in_stack_ffffffffffffffe8;
  
  pUVar1 = get_userdata(in_stack_ffffffffffffffe8);
  _Var2 = ftello((FILE *)pUVar1->fp);
  if (_Var2 == -1) {
    piVar3 = __errno_location();
    pUVar1->errnum = *piVar3;
    __errno_location();
    al_set_errno((int)((ulong)pUVar1 >> 0x20));
  }
  return _Var2;
}

Assistant:

static int64_t file_stdio_ftell(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);
   int64_t ret;

#if defined(ALLEGRO_HAVE_FTELLO)
   ret = ftello(userdata->fp);
#elif defined(ALLEGRO_HAVE_FTELLI64)
   ret = _ftelli64(userdata->fp);
#else
   ret = ftell(userdata->fp);
#endif
   if (ret == -1) {
      userdata->errnum = errno;
      al_set_errno(errno);
   }

   return ret;
}